

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_general.cpp
# Opt level: O2

int main(void)

{
  TestMaterial clone_universe;
  TestMaterial universe;
  
  TestMaterial::TestMaterial(&universe,true);
  TestMaterial::initializeUniverse(&universe);
  TestMaterial::GeneralTest(&universe);
  TestMaterial::TestMaterial(&clone_universe,true);
  CloneUniverse(&universe,&clone_universe);
  TestMaterial::GeneralTest(&clone_universe);
  TestMaterial::~TestMaterial(&clone_universe);
  TestMaterial::~TestMaterial(&universe);
  return 0;
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  TestMaterial universe = TestMaterial(NON_STP_BV_OBJECTS);
  universe.initializeUniverse();
  universe.GeneralTest();
  {
    TestMaterial clone_universe(NON_STP_BV_OBJECTS);
    CloneUniverse(universe, clone_universe);
    clone_universe.GeneralTest();
  }
  return 0;
}